

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::DeepTiledInputFile::Data::readTiles
          (Data *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly,bool countsOnly)

{
  undefined4 *__s;
  TileProcess *this_00;
  uint uVar1;
  __base_type _Var2;
  pointer pTVar3;
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*> this_01;
  atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*> aVar4;
  int iVar5;
  __base_type _Var6;
  Task *this_02;
  ostream *poVar7;
  atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*> aVar8;
  InputExc *pIVar9;
  IoExc *this_03;
  undefined4 in_register_0000000c;
  long lVar10;
  ulong uVar11;
  pointer pTVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  TaskGroup tg;
  exr_chunk_info_t cinfo;
  TileProcessGroup tpg;
  stringstream _iex_throw_s;
  ostream aoStack_268 [16];
  uint64_t uStack_258;
  uint64_t local_250;
  uint64_t uStack_248;
  uint64_t local_240;
  uint64_t uStack_238;
  
  uVar11 = CONCAT44(in_register_0000000c,dy1);
  if (1 < ((dy2 - dy1) + 1) * ((dx2 - dx1) + 1)) {
    uVar1 = this->numThreads;
    uVar14 = (ulong)(int)uVar1;
    if (1 < (long)uVar14) {
      IlmThread_3_4::Semaphore::Semaphore(&tpg._sem,uVar1);
      tpg._fixed_pool.
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tpg._avail_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
      tpg._fixed_pool.
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tpg._fixed_pool.
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tpg._first_failure._M_b._M_p = (__base_type)(__pointer_type)0x0;
      _Var6._M_p = (__pointer_type)operator_new(uVar14 * 0x248);
      for (lVar10 = 0;
          pTVar3 = tpg._fixed_pool.
                   super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          pTVar12 = tpg._fixed_pool.
                    super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
                    ._M_impl.super__Vector_impl_data._M_start, uVar14 * 0x248 - lVar10 != 0;
          lVar10 = lVar10 + 0x248) {
        __s = (undefined4 *)((long)&(_Var6._M_p)->last_decode_err + lVar10);
        memset(__s,0,0x248);
        *__s = 0x21;
        *(undefined1 *)(__s + 1) = 1;
      }
      for (lVar10 = 0; this_00 = (TileProcess *)((long)&pTVar12->last_decode_err + lVar10),
          this_00 != pTVar3; lVar10 = lVar10 + 0x248) {
        memcpy((void *)((long)&(_Var6._M_p)->last_decode_err + lVar10),this_00,0x248);
        anon_unknown_14::TileProcess::~TileProcess(this_00);
      }
      std::
      _Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
      ::_M_deallocate((_Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
                       *)tpg._fixed_pool.
                         super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                      (pointer)(((long)tpg._fixed_pool.
                                       super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)tpg._fixed_pool.
                                      super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x248),
                      ((long)tpg._fixed_pool.
                             super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)tpg._fixed_pool.
                            super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
                            ._M_impl.super__Vector_impl_data._M_start) % 0x248);
      tpg._fixed_pool.
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
      ._M_impl.super__Vector_impl_data._M_finish = _Var6._M_p + uVar14;
      _Var2._M_p = _Var6._M_p;
      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
        pTVar12 = _Var2._M_p + 1;
        if (uVar1 - 1 == uVar11) {
          pTVar12 = (pointer)0x0;
        }
        (_Var2._M_p)->next = pTVar12;
        _Var2._M_p = _Var2._M_p + 1;
      }
      LOCK();
      UNLOCK();
      tpg._fixed_pool.
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
      ._M_impl.super__Vector_impl_data._M_start = _Var6._M_p;
      tpg._fixed_pool.
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           tpg._fixed_pool.
           super__Vector_base<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      tpg._avail_head._M_b._M_p = (__base_type)(__base_type)_Var6._M_p;
      IlmThread_3_4::TaskGroup::TaskGroup(&tg);
      for (; iVar13 = dx1, dy1 <= dy2; dy1 = dy1 + 1) {
        for (; iVar13 <= dx2; iVar13 = iVar13 + 1) {
          iVar5 = exr_read_tile_chunk_info
                            (*(this->_ctxt->_ctxt).
                              super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,this->partNumber,iVar13,dy1,lx,ly,&cinfo);
          if (iVar5 != 0) {
            if (iVar5 == 0x18) {
              iex_debugTrap();
              std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
              poVar7 = std::operator<<(aoStack_268,"Tile (");
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar13);
              poVar7 = std::operator<<(poVar7,", ");
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,dy1);
              poVar7 = std::operator<<(poVar7,", ");
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,lx);
              poVar7 = std::operator<<(poVar7,", ");
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,ly);
              std::operator<<(poVar7,") is missing.");
              pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::InputExc::InputExc(pIVar9,(stringstream *)&_iex_throw_s);
              __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
            }
            pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::InputExc::InputExc(pIVar9,"Unable to query tile information");
            __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
          }
          this_02 = (Task *)operator_new(0x30);
          IlmThread_3_4::Task::Task(this_02,&tg);
          *(undefined ***)this_02 = &PTR__TileBufferTask_001e3288;
          *(DeepFrameBuffer **)(this_02 + 0x10) = &this->frameBuffer;
          *(Data **)(this_02 + 0x18) = this;
          IlmThread_3_4::Semaphore::wait();
          aVar8 = tpg._avail_head;
          do {
            _Var6 = aVar8._M_b._M_p;
            if (_Var6._M_p == (__pointer_type)0x0) {
              poVar7 = std::operator<<((ostream *)&std::cerr,"GACK: serious failure case???");
              std::endl<char,std::char_traits<char>>(poVar7);
            }
            LOCK();
            bVar15 = (__base_type)_Var6._M_p != tpg._avail_head._M_b._M_p;
            aVar8._M_b._M_p = (__base_type)(__base_type)_Var6._M_p;
            aVar4._M_b._M_p = (__base_type)(__base_type)(_Var6._M_p)->next;
            if (bVar15) {
              aVar8._M_b._M_p = tpg._avail_head._M_b._M_p;
              aVar4._M_b._M_p = tpg._avail_head._M_b._M_p;
            }
            tpg._avail_head._M_b._M_p = aVar4._M_b._M_p;
            UNLOCK();
          } while (bVar15);
          *(__pointer_type *)(this_02 + 0x20) = _Var6._M_p;
          *(TileProcessGroup **)(this_02 + 0x28) = &tpg;
          ((_Var6._M_p)->cinfo).sample_count_data_offset = cinfo.sample_count_data_offset;
          ((_Var6._M_p)->cinfo).sample_count_table_size = cinfo.sample_count_table_size;
          ((_Var6._M_p)->cinfo).packed_size = cinfo.packed_size;
          ((_Var6._M_p)->cinfo).unpacked_size = cinfo.unpacked_size;
          ((_Var6._M_p)->cinfo).width = cinfo.width;
          ((_Var6._M_p)->cinfo).level_x = cinfo.level_x;
          ((_Var6._M_p)->cinfo).level_y = cinfo.level_y;
          ((_Var6._M_p)->cinfo).type = cinfo.type;
          ((_Var6._M_p)->cinfo).compression = cinfo.compression;
          ((_Var6._M_p)->cinfo).data_offset = cinfo.data_offset;
          ((_Var6._M_p)->cinfo).idx = cinfo.idx;
          ((_Var6._M_p)->cinfo).start_x = cinfo.start_x;
          ((_Var6._M_p)->cinfo).start_y = cinfo.start_y;
          ((_Var6._M_p)->cinfo).height = cinfo.height;
          (_Var6._M_p)->counts_only = countsOnly;
          IlmThread_3_4::ThreadPool::addGlobalTask(this_02);
        }
      }
      IlmThread_3_4::TaskGroup::~TaskGroup(&tg);
      this_01 = tpg._first_failure;
      LOCK();
      tpg._first_failure._M_b._M_p = (__base_type)(__pointer_type)0x0;
      UNLOCK();
      if (this_01._M_b._M_p == (__pointer_type)0x0) {
        IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true>::
        ~ProcessGroup(&tpg);
        return;
      }
      std::__cxx11::string::string((string *)&_iex_throw_s,(string *)this_01._M_b._M_p);
      std::__cxx11::string::~string((string *)this_01._M_b._M_p);
      operator_delete((void *)this_01._M_b._M_p,0x20);
      this_03 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(this_03,(string *)&_iex_throw_s);
      __cxa_throw(this_03,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
  }
  __iex_throw_s = 0x21;
  do {
    iVar13 = dx1;
    if (dy2 < (int)uVar11) {
      anon_unknown_14::TileProcess::~TileProcess((TileProcess *)&_iex_throw_s);
      return;
    }
    for (; iVar13 <= dx2; iVar13 = iVar13 + 1) {
      iVar5 = exr_read_tile_chunk_info
                        (*(this->_ctxt->_ctxt).
                          super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,this->partNumber,iVar13,uVar11,lx,ly,&cinfo);
      if (iVar5 != 0) {
        if (iVar5 == 0x18) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&tpg);
          poVar7 = std::operator<<((ostream *)&tpg.field_0x10,"Tile (");
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar13);
          poVar7 = std::operator<<(poVar7,", ");
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(int)uVar11);
          poVar7 = std::operator<<(poVar7,", ");
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,lx);
          poVar7 = std::operator<<(poVar7,", ");
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,ly);
          std::operator<<(poVar7,") is missing.");
          pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::InputExc::InputExc(pIVar9,(stringstream *)&tpg);
          __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
        }
        pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::InputExc::InputExc(pIVar9,"Unable to query tile information");
        __cxa_throw(pIVar9,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
      }
      local_240 = cinfo.sample_count_data_offset;
      uStack_238 = cinfo.sample_count_table_size;
      local_250 = cinfo.packed_size;
      uStack_248 = cinfo.unpacked_size;
      aoStack_268._8_8_ = cinfo._16_8_;
      uStack_258 = cinfo.data_offset;
      aoStack_268._0_8_ = cinfo._8_8_;
      anon_unknown_14::TileProcess::run_decode
                ((TileProcess *)&_iex_throw_s,
                 *(this->_ctxt->_ctxt).
                  super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 this->partNumber,&this->frameBuffer,&this->fill_list);
      uVar11 = uVar11 & 0xffffffff;
    }
    uVar11 = (ulong)((int)uVar11 + 1);
  } while( true );
}

Assistant:

void DeepTiledInputFile::Data::readTiles (
    int dx1, int dx2, int dy1, int dy2, int lx, int ly, bool countsOnly)
{
    int nTiles = dx2 - dx1 + 1;
    nTiles *= dy2 - dy1 + 1;

    exr_chunk_info_t      cinfo;
#if ILMTHREAD_THREADING_ENABLED
    if (nTiles > 1 && numThreads > 1)
    {
        // we need the lifetime of this to last longer than the
        // lifetime of the task group below such that we don't get use
        // after free type error, so use scope rules to accomplish
        // this
        TileProcessGroup tpg (numThreads);

        {
            ILMTHREAD_NAMESPACE::TaskGroup tg;

            for (int ty = dy1; ty <= dy2; ++ty)
            {
                for (int tx = dx1; tx <= dx2; ++tx)
                {
                    exr_result_t rv = exr_read_tile_chunk_info (
                        *_ctxt, partNumber, tx, ty, lx, ly, &cinfo);
                    if (EXR_ERR_INCOMPLETE_CHUNK_TABLE == rv)
                    {
                        THROW (
                            IEX_NAMESPACE::InputExc,
                            "Tile (" << tx << ", " << ty << ", " << lx << ", " << ly
                            << ") is missing.");
                    }
                    else if (EXR_ERR_SUCCESS != rv)
                        throw IEX_NAMESPACE::InputExc ("Unable to query tile information");

                    ILMTHREAD_NAMESPACE::ThreadPool::addGlobalTask (
                        new TileBufferTask (&tg, this, &tpg, &frameBuffer, cinfo, countsOnly) );
                }
            }
        }

        tpg.throw_on_failure ();
    }
    else
#endif
    {
        TileProcess tp;

        tp.counts_only = countsOnly;
        for (int ty = dy1; ty <= dy2; ++ty)
        {
            for (int tx = dx1; tx <= dx2; ++tx)
            {
                exr_result_t rv = exr_read_tile_chunk_info (
                    *_ctxt, partNumber, tx, ty, lx, ly, &cinfo);
                if (EXR_ERR_INCOMPLETE_CHUNK_TABLE == rv)
                {
                    THROW (
                        IEX_NAMESPACE::InputExc,
                        "Tile (" << tx << ", " << ty << ", " << lx << ", " << ly
                        << ") is missing.");
                }
                else if (EXR_ERR_SUCCESS != rv)
                    throw IEX_NAMESPACE::InputExc ("Unable to query tile information");

                tp.cinfo = cinfo;
                tp.run_decode (
                    *_ctxt,
                    partNumber,
                    &frameBuffer,
                    fill_list);
            }
        }
    }
}